

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::ShaderStorageBufferObjectBase::SupportedInTES
          (ShaderStorageBufferObjectBase *this,int requiredTES)

{
  int iVar1;
  ostream *poVar2;
  GLint blocksTES;
  ostringstream reason;
  int local_1bc;
  string local_1b8;
  ostringstream local_198 [376];
  
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x90d9,&local_1bc);
  iVar1 = local_1bc;
  if (local_1bc < requiredTES) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar2 = std::operator<<((ostream *)local_198,"Required ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,requiredTES);
    poVar2 = std::operator<<(poVar2," TES storage blocks but only ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1bc);
    poVar2 = std::operator<<(poVar2," available.");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    deqp::SubcaseBase::OutputNotSupported(&this->super_SubcaseBase,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return requiredTES <= iVar1;
}

Assistant:

bool SupportedInTES(int requiredTES)
	{
		GLint blocksTES;
		glGetIntegerv(GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS, &blocksTES);
		if (blocksTES >= requiredTES)
			return true;
		else
		{
			std::ostringstream reason;
			reason << "Required " << requiredTES << " TES storage blocks but only " << blocksTES << " available."
				   << std::endl;
			OutputNotSupported(reason.str());
			return false;
		}
	}